

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::focusInEvent(QAbstractItemView *this,QFocusEvent *event)

{
  undefined1 uVar1;
  long lVar2;
  int iVar3;
  ItemFlags IVar4;
  QItemSelectionModel *pQVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  QWidget::focusInEvent((QWidget *)this,event);
  pQVar5 = selectionModel(this);
  currentIndex(&local_58,this);
  if ((local_58.r < 0) || (local_58.c < 0)) {
    if (pQVar5 != (QItemSelectionModel *)0x0) {
      bVar7 = false;
      goto LAB_004e491d;
    }
LAB_004e49f9:
    bVar7 = false;
  }
  else {
    bVar7 = local_58.m.ptr != (QAbstractItemModel *)0x0;
    if (pQVar5 == (QItemSelectionModel *)0x0) {
      if (local_58.m.ptr != (QAbstractItemModel *)0x0) goto LAB_004e4a06;
      goto LAB_004e49f9;
    }
LAB_004e491d:
    if ((bVar7) || (*(char *)(lVar2 + 0x490) != '\0')) {
      if (!bVar7) goto LAB_004e49f9;
    }
    else {
      uVar1 = *(undefined1 *)(lVar2 + 0x418);
      *(undefined1 *)(lVar2 + 0x418) = 0;
      local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.r = -0x55555556;
      local_58.c = -0x55555556;
      local_58.i._0_4_ = 0xaaaaaaaa;
      local_58.i._4_4_ = 0xaaaaaaaa;
      (**(code **)(*(long *)this + 0x2a8))(&local_58,this,8,0);
      if (((local_58.r < 0) ||
          (((local_58.c < 0 || (local_58.m.ptr == (QAbstractItemModel *)0x0)) ||
           (uVar6 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x138))
                              (*(long **)(lVar2 + 0x2f8),&local_58), (uVar6 & 0x20) == 0)))) ||
         (iVar3 = QFocusEvent::reason(), iVar3 == 0)) {
        *(undefined1 *)(lVar2 + 0x418) = uVar1;
        goto LAB_004e49f9;
      }
      pQVar5 = selectionModel(this);
      (**(code **)(*(long *)pQVar5 + 0x60))(pQVar5,&local_58,0);
      *(undefined1 *)(lVar2 + 0x418) = uVar1;
    }
    currentIndex(&local_58,this);
    IVar4 = QModelIndex::flags(&local_58);
    bVar7 = SUB41(((uint)IVar4.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                         super_QFlagsStorage<Qt::ItemFlag>.i & 2) >> 1,0);
  }
  QWidget::setAttribute((QWidget *)this,WA_InputMethodEnabled,bVar7);
LAB_004e4a06:
  QWidget::update(*(QWidget **)(lVar2 + 0x2b0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::focusInEvent(QFocusEvent *event)
{
    Q_D(QAbstractItemView);
    QAbstractScrollArea::focusInEvent(event);

    const QItemSelectionModel* model = selectionModel();
    bool currentIndexValid = currentIndex().isValid();

    if (model
        && !d->currentIndexSet
        && !currentIndexValid) {
        bool autoScroll = d->autoScroll;
        d->autoScroll = false;
        QModelIndex index = moveCursor(MoveNext, Qt::NoModifier); // first visible index
        if (index.isValid() && d->isIndexEnabled(index) && event->reason() != Qt::MouseFocusReason) {
            selectionModel()->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
            currentIndexValid = true;
        }
        d->autoScroll = autoScroll;
    }

    if (model && currentIndexValid)
        setAttribute(Qt::WA_InputMethodEnabled, (currentIndex().flags() & Qt::ItemIsEditable));
    else if (!currentIndexValid)
        setAttribute(Qt::WA_InputMethodEnabled, false);

    d->viewport->update();
}